

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++:871:31)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_c__:871:31)>
      *this)

{
  NullableValue<kj::_::PromiseBase>::operator=
            (&(((this->func).intermediate)->value).ptr,(void *)0x0);
  return;
}

Assistant:

void run() override {
    func();
  }